

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

vec2 __thiscall djb::tab_r::h2_to_u2_std_radial(tab_r *this,vec3 *wm,float_t zi,float_t param_3)

{
  vec2 vVar1;
  float fVar2;
  float u1;
  float __x;
  vec2 local_40;
  float local_38;
  float_t fStack_34;
  float_t fStack_30;
  float_t fStack_2c;
  float_t local_28;
  
  fVar2 = 0.0;
  if (wm->z <= 1.0 && wm->z != 1.0) {
    fVar2 = atan2f(wm->y,wm->x);
  }
  u1 = (fVar2 / 3.1415927 + 1.0) * 0.5;
  fVar2 = 0.0;
  if (0.0 <= wm->z) {
    fVar2 = wm->z;
  }
  __x = 1.0;
  if (fVar2 <= 1.0) {
    __x = fVar2;
  }
  fVar2 = acosf(__x);
  fVar2 = fVar2 * 0.63661975;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  local_28 = cdf1(this,u1,zi);
  local_40.y = 1.0;
  local_40.x = u1;
  vVar1 = cdfv(this,&local_40,zi);
  local_38 = vVar1.y;
  local_40.x = u1;
  local_40.y = fVar2;
  fStack_34 = local_38;
  fStack_30 = local_38;
  fStack_2c = local_38;
  vVar1 = cdfv(this,&local_40,zi);
  vVar1.y = vVar1.y / local_38;
  vVar1.x = local_28;
  return vVar1;
}

Assistant:

vec2 tab_r::h2_to_u2_std_radial(const vec3 &wm, float_t zi, float_t) const
{
	float_t pm = wm.z < 1 ? atan2(wm.y, wm.x) : 0;
	float_t u1 = (pm / m_pi() + 1) / 2;
	float_t u2 = sqrt(acos(sat(wm.z)) * (2 / m_pi()));

	return vec2(cdf1(u1, zi), cdf2(u2, u1, zi));
}